

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sigslot.hpp
# Opt level: O0

bool __thiscall
utils::detail::slot<void(float,float)>::operator()
          (slot<void(float,float)> *this,double *args,double *args_1)

{
  bool bVar1;
  uint uVar2;
  element_type *peVar3;
  element_type *peVar4;
  undefined1 local_38 [8];
  shared_ptr<utils::detail::shared_ptr_continer> shared;
  double *args_local_1;
  double *args_local;
  slot<void_(float,_float)> *this_local;
  
  shared.super___shared_ptr<utils::detail::shared_ptr_continer,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)args_1;
  bVar1 = std::function::operator_cast_to_bool((function *)this);
  if (bVar1) {
    if (((byte)this[0x30] & 1) == 0) {
      std::function<void_(float,_float)>::operator()
                ((function<void_(float,_float)> *)this,(float)*args,
                 (float)(double)(shared.
                                 super___shared_ptr<utils::detail::shared_ptr_continer,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_refcount._M_pi)->_vptr__Sp_counted_base);
    }
    else {
      peVar3 = std::
               __shared_ptr_access<utils::detail::weak_ptr_continer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<utils::detail::weak_ptr_continer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)(this + 0x20));
      (**peVar3->_vptr_weak_ptr_continer)();
      peVar4 = std::
               __shared_ptr_access<utils::detail::shared_ptr_continer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<utils::detail::shared_ptr_continer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_38);
      uVar2 = (**peVar4->_vptr_shared_ptr_continer)();
      bVar1 = (uVar2 & 1) != 0;
      if (bVar1) {
        std::function<void_(float,_float)>::operator()
                  ((function<void_(float,_float)> *)this,(float)*args,
                   (float)(double)(shared.
                                   super___shared_ptr<utils::detail::shared_ptr_continer,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_refcount._M_pi)->_vptr__Sp_counted_base);
      }
      else {
        this_local._7_1_ = 0;
      }
      std::shared_ptr<utils::detail::shared_ptr_continer>::~shared_ptr
                ((shared_ptr<utils::detail::shared_ptr_continer> *)local_38);
      if (!bVar1) goto LAB_00125bc9;
    }
    this_local._7_1_ = 1;
  }
  else {
    this_local._7_1_ = 0;
  }
LAB_00125bc9:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool operator()(_Args &&... args)
    {
        if (!m_func)
        {
            return false;
        }
        if (m_tracked)
        {
            auto shared = m_weak->lock();
            if (shared->operator bool())
            {
                m_func(std::forward<_Args>(args)...);
            }
            else
            {
                return false;
            }
            
        }
        else
        {
            m_func(std::forward<_Args>(args)...);
        }

        return true;
    }